

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O3

int entropy_update(mbedtls_entropy_context *ctx,uchar source_id,uchar *data,size_t len)

{
  int iVar1;
  uchar header [2];
  uchar tmp [64];
  uchar local_6a;
  undefined1 local_69;
  uchar local_68 [64];
  
  if (0x40 < len) {
    iVar1 = mbedtls_sha512_ret(data,len,local_68,0);
    if (iVar1 != 0) goto LAB_0012a4d0;
    len = 0x40;
    data = local_68;
  }
  local_69 = (undefined1)len;
  local_6a = source_id;
  if ((ctx->accumulator_started != 0) ||
     (iVar1 = mbedtls_sha512_starts_ret(&ctx->accumulator,0), iVar1 == 0)) {
    ctx->accumulator_started = 1;
    iVar1 = mbedtls_sha512_update_ret(&ctx->accumulator,&local_6a,2);
    if (iVar1 == 0) {
      iVar1 = mbedtls_sha512_update_ret(&ctx->accumulator,data,len);
    }
  }
LAB_0012a4d0:
  mbedtls_platform_zeroize(local_68,0x40);
  return iVar1;
}

Assistant:

static int entropy_update( mbedtls_entropy_context *ctx, unsigned char source_id,
                           const unsigned char *data, size_t len )
{
    unsigned char header[2];
    unsigned char tmp[MBEDTLS_ENTROPY_BLOCK_SIZE];
    size_t use_len = len;
    const unsigned char *p = data;
    int ret = 0;

    if( use_len > MBEDTLS_ENTROPY_BLOCK_SIZE )
    {
#if defined(MBEDTLS_ENTROPY_SHA512_ACCUMULATOR)
        if( ( ret = mbedtls_sha512_ret( data, len, tmp, 0 ) ) != 0 )
            goto cleanup;
#else
        if( ( ret = mbedtls_sha256_ret( data, len, tmp, 0 ) ) != 0 )
            goto cleanup;
#endif
        p = tmp;
        use_len = MBEDTLS_ENTROPY_BLOCK_SIZE;
    }

    header[0] = source_id;
    header[1] = use_len & 0xFF;

    /*
     * Start the accumulator if this has not already happened. Note that
     * it is sufficient to start the accumulator here only because all calls to
     * gather entropy eventually execute this code.
     */
#if defined(MBEDTLS_ENTROPY_SHA512_ACCUMULATOR)
    if( ctx->accumulator_started == 0 &&
        ( ret = mbedtls_sha512_starts_ret( &ctx->accumulator, 0 ) ) != 0 )
        goto cleanup;
    else
        ctx->accumulator_started = 1;
    if( ( ret = mbedtls_sha512_update_ret( &ctx->accumulator, header, 2 ) ) != 0 )
        goto cleanup;
    ret = mbedtls_sha512_update_ret( &ctx->accumulator, p, use_len );
#else
    if( ctx->accumulator_started == 0 &&
        ( ret = mbedtls_sha256_starts_ret( &ctx->accumulator, 0 ) ) != 0 )
        goto cleanup;
    else
        ctx->accumulator_started = 1;
    if( ( ret = mbedtls_sha256_update_ret( &ctx->accumulator, header, 2 ) ) != 0 )
        goto cleanup;
    ret = mbedtls_sha256_update_ret( &ctx->accumulator, p, use_len );
#endif

cleanup:
    mbedtls_platform_zeroize( tmp, sizeof( tmp ) );

    return( ret );
}